

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
               (int *args,int *args_1,short *args_2)

{
  DrawFogBoundaryLinePalCommand *pDVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  DrawFogBoundaryLinePalCommand *local_d8;
  DrawFogBoundaryLinePalCommand *local_d0;
  DrawFogBoundaryLinePalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_aa;
  _lambda_void___1_ local_a9;
  undefined1 local_a8 [8];
  DrawFogBoundaryLinePalCommand command;
  DrawerCommandQueue *queue;
  short *args_local_2;
  int *args_local_1;
  int *args_local;
  
  command._destorg = (uint8_t *)Instance();
  if ((((DrawerCommandQueue *)command._destorg)->threaded_render == 0) ||
     (bVar2 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar2)) {
    swrenderer::DrawFogBoundaryLinePalCommand::DrawFogBoundaryLinePalCommand
              ((DrawFogBoundaryLinePalCommand *)local_a8,*args,*args_1,(int)*args_2);
    tryBlock = QueueCommand(int&,int_const&,short&)::{lambda(void*)#1}::
               operator_cast_to_function_pointer(&local_a9);
    catchBlock = QueueCommand(int&,int_const&,short&)::{lambda(void*,char_const*,bool)#1}::
                 operator_cast_to_function_pointer(&local_aa);
    VectoredTryCatch((DrawFogBoundaryLinePalCommand *)local_a8,tryBlock,catchBlock);
    swrenderer::DrawFogBoundaryLinePalCommand::~DrawFogBoundaryLinePalCommand
              ((DrawFogBoundaryLinePalCommand *)local_a8);
  }
  else {
    command_1 = (DrawFogBoundaryLinePalCommand *)AllocMemory(0x80);
    if (command_1 == (DrawFogBoundaryLinePalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command._destorg);
      command_1 = (DrawFogBoundaryLinePalCommand *)AllocMemory(0x80);
      if (command_1 == (DrawFogBoundaryLinePalCommand *)0x0) {
        return;
      }
    }
    pDVar1 = command_1;
    swrenderer::DrawFogBoundaryLinePalCommand::DrawFogBoundaryLinePalCommand
              (command_1,*args,*args_1,(int)*args_2);
    local_d0 = pDVar1;
    local_d8 = pDVar1;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (command._destorg + 0x1000008),(value_type *)&local_d8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}